

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::dirhexdump(XipFile *this)

{
  uint uVar1;
  size_t sVar2;
  element_type *peVar3;
  reference pvVar4;
  size_type sVar5;
  size_t sVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  string local_f0;
  uint local_cc;
  undefined1 local_c8 [4];
  uint i_1;
  undefined1 local_b8 [24];
  undefined1 local_a0 [8];
  ByteVector fileentries;
  uint local_64;
  undefined1 local_60 [4];
  uint i;
  undefined1 local_50 [40];
  undefined1 local_28 [8];
  ByteVector modentries;
  XipFile *this_local;
  
  uVar1 = (this->_hdr).nummods;
  modentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  sVar2 = TocEntry::size();
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(local_50 + 0x27));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,uVar1 * sVar2,
             (allocator<unsigned_char> *)(local_50 + 0x27));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)(local_50 + 0x27));
  rd((XipFile *)local_50);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_50);
  (*peVar3->_vptr_ReadWriter[4])(peVar3,(ulong)(this->_hdr).modlistpos);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_50);
  rd((XipFile *)local_60);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_60);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  (*peVar3->_vptr_ReadWriter[2])(peVar3,pvVar4,sVar5);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_60);
  printf("offset     attr     ftlo     fthi     size     nameptr  e32      o32      baseaddr\n");
  for (local_64 = 0; local_64 < (this->_hdr).nummods; local_64 = local_64 + 1) {
    uVar1 = (this->_hdr).modlistpos;
    sVar2 = TocEntry::size();
    sVar6 = TocEntry::size();
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                        local_64 * sVar6);
    sVar6 = TocEntry::size();
    hexdump<unsigned_char*>
              ((string *)
               &fileentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,(int)(sVar6 >> 2),4,
               ET_LITTLEENDIAN);
    uVar7 = std::__cxx11::string::c_str();
    printf("%08lx: %s\n",(ulong)uVar1 + local_64 * sVar2,uVar7);
    std::__cxx11::string::~string
              ((string *)
               &fileentries.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  uVar1 = (this->_hdr).numfiles;
  sVar2 = FileEntry::size();
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(local_b8 + 0x17));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,uVar1 * sVar2,
             (allocator<unsigned_char> *)(local_b8 + 0x17));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)(local_b8 + 0x17));
  rd((XipFile *)local_b8);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_b8);
  (*peVar3->_vptr_ReadWriter[4])(peVar3,(ulong)(this->_hdr).filelistpos);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_b8);
  rd((XipFile *)local_c8);
  peVar3 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_c8);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,0);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  (*peVar3->_vptr_ReadWriter[2])(peVar3,pvVar4,sVar5);
  std::shared_ptr<ReadWriter>::~shared_ptr((shared_ptr<ReadWriter> *)local_c8);
  printf("offset     attr     ftlo     fthi     fullsize compsize nameptr  dataptr\n");
  for (local_cc = 0; local_cc < (this->_hdr).numfiles; local_cc = local_cc + 1) {
    uVar1 = (this->_hdr).filelistpos;
    uVar8 = (ulong)local_cc;
    sVar2 = FileEntry::size();
    uVar9 = (ulong)local_cc;
    sVar6 = FileEntry::size();
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,
                        uVar9 * sVar6);
    sVar6 = FileEntry::size();
    hexdump<unsigned_char*>(&local_f0,pvVar4,(int)(sVar6 >> 2),4,ET_LITTLEENDIAN);
    uVar7 = std::__cxx11::string::c_str();
    printf("%08lx: %s\n",(ulong)uVar1 + uVar8 * sVar2,uVar7);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

virtual void dirhexdump()
    {
        // first dump modules
        ByteVector modentries(_hdr.nummods*TocEntry::size());
        rd()->setpos(_hdr.modlistpos);
        rd()->read(&modentries[0], modentries.size());
        printf("offset     attr     ftlo     fthi     size     nameptr  e32      o32      baseaddr\n");
        for (unsigned i=0  ; i<_hdr.nummods ; i++)
            printf("%08lx: %s\n", _hdr.modlistpos+i*TocEntry::size(), hexdump(&modentries[i*TocEntry::size()], TocEntry::size()/4, 4).c_str());

        ByteVector fileentries(_hdr.numfiles*FileEntry::size());
        rd()->setpos(_hdr.filelistpos);
        rd()->read(&fileentries[0], fileentries.size());
        printf("offset     attr     ftlo     fthi     fullsize compsize nameptr  dataptr\n");
        for (unsigned i=0  ; i<_hdr.numfiles ; i++)
            printf("%08lx: %s\n", _hdr.filelistpos+i*FileEntry::size(), hexdump(&fileentries[i*FileEntry::size()], FileEntry::size()/4, 4).c_str());
    }